

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdecode.c
# Opt level: O0

FT_Int cff_lookup_glyph_by_stdcharcode(CFF_Font_conflict cff,FT_Int charcode)

{
  FT_UShort FVar1;
  FT_Service_CFFLoad cffload;
  uint local_20;
  FT_UShort glyph_sid;
  FT_UInt n;
  FT_Int charcode_local;
  CFF_Font_conflict cff_local;
  
  if ((((cff->charset).sids != (FT_UShort *)0x0) && (-1 < charcode)) && (charcode < 0x100)) {
    FVar1 = (**cff->cffload)(charcode);
    for (local_20 = 0; local_20 < cff->num_glyphs; local_20 = local_20 + 1) {
      if ((cff->charset).sids[local_20] == FVar1) {
        return local_20;
      }
    }
  }
  return -1;
}

Assistant:

FT_LOCAL_DEF( FT_Int )
  cff_lookup_glyph_by_stdcharcode( CFF_Font  cff,
                                   FT_Int    charcode )
  {
    FT_UInt    n;
    FT_UShort  glyph_sid;

    FT_Service_CFFLoad  cffload;


    /* CID-keyed fonts don't have glyph names */
    if ( !cff->charset.sids )
      return -1;

    /* check range of standard char code */
    if ( charcode < 0 || charcode > 255 )
      return -1;

#if 0
    /* retrieve cffload from list of current modules */
    FT_Service_CFFLoad  cffload;


    FT_FACE_FIND_GLOBAL_SERVICE( face, cffload, CFF_LOAD );
    if ( !cffload )
    {
      FT_ERROR(( "cff_lookup_glyph_by_stdcharcode:"
                 " the `cffload' module is not available\n" ));
      return FT_THROW( Unimplemented_Feature );
    }
#endif

    cffload = (FT_Service_CFFLoad)cff->cffload;

    /* Get code to SID mapping from `cff_standard_encoding'. */
    glyph_sid = cffload->get_standard_encoding( (FT_UInt)charcode );

    for ( n = 0; n < cff->num_glyphs; n++ )
    {
      if ( cff->charset.sids[n] == glyph_sid )
        return (FT_Int)n;
    }

    return -1;
  }